

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::Builder::Builder(Builder *this,VersionSet *vset,Version *base)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this->vset_ = vset;
  this->base_ = base;
  lVar4 = 0;
  do {
    lVar1 = (long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_color + lVar4;
    *(undefined4 *)
     ((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
     lVar4) = 0;
    *(undefined8 *)
     ((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
     lVar4) = 0;
    *(long *)((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left + lVar4) = lVar1;
    *(long *)((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_right + lVar4) = lVar1;
    *(undefined8 *)
     ((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar4
     ) = 0;
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0x188);
  base->refs_ = base->refs_ + 1;
  lVar4 = 0x40;
  do {
    puVar3 = (undefined8 *)operator_new(0x30);
    *puVar3 = &vset->icmp_;
    *(undefined4 *)(puVar3 + 1) = 0;
    puVar3[2] = 0;
    puVar3[3] = puVar3 + 1;
    puVar3[4] = puVar3 + 1;
    puVar3[5] = 0;
    *(undefined8 **)((long)this->levels_ + lVar4 + -0x10) = puVar3;
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0x1c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Builder(VersionSet* vset, Version* base) : vset_(vset), base_(base) {
    base_->Ref();
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      levels_[level].added_files = new FileSet(cmp);
    }
  }